

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  Impl *this_00;
  size_t sVar1;
  undefined1 uVar2;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  String *pSVar7;
  bool bVar8;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  undefined1 local_50 [32];
  
  sVar5 = path.parts.size_;
  pSVar7 = path.parts.ptr;
  if (sVar5 == 1) {
    kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
    this_00 = &(this->impl).value;
    sVar5 = (pSVar7->content).size_;
    if (sVar5 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar7->content).ptr;
    }
    name.content.size_ = sVar5 + (sVar5 == 0);
    name.content.ptr = pcVar6;
    MVar3 = Impl::openEntry(this_00,name,mode);
    bVar8 = MVar3.ptr != (EntryImpl *)0x0;
    if (bVar8) {
      local_50._0_8_ = (*(code *)**(undefined8 **)this_00->clock)();
      heapString((String *)(local_50 + 8),content.content.ptr,content.content.size_ - 1);
      if (((MVar3.ptr)->node).tag != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy(&(MVar3.ptr)->node);
      }
      ((MVar3.ptr)->node).field_1.forceAligned = (void *)local_50._0_8_;
      *(undefined8 *)((long)&((MVar3.ptr)->node).field_1 + 8) = local_50._8_8_;
      *(undefined8 *)((long)&((MVar3.ptr)->node).field_1 + 0x10) = local_50._16_8_;
      *(undefined8 *)((long)&((MVar3.ptr)->node).field_1 + 0x18) = local_50._24_8_;
      ((MVar3.ptr)->node).tag = 3;
      lVar4 = (*(code *)**(undefined8 **)this_00->clock)();
      (this->impl).value.lastModified.value.value = lVar4;
    }
    kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
  }
  else {
    if (sVar5 == 0) {
      if ((mode & CREATE) != 0) {
        return false;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4d4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      sVar1 = (pSVar7->content).size_;
      if (sVar1 == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (pSVar7->content).ptr;
      }
      name_00.content.size_ = (size_t)pcVar6;
      name_00.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_50,name_00,(int)sVar1 + (uint)(sVar1 == 0));
      if ((_func_int **)local_50._8_8_ != (_func_int **)0x0) {
        uVar2 = (**(code **)(*(_func_int **)local_50._8_8_ + 0x98))
                          (local_50._8_8_,pSVar7 + 1,sVar5 - 1,content.content.ptr,
                           content.content.size_,mode);
        (**(code **)(((String *)local_50._0_8_)->content).ptr)
                  (local_50._0_8_,local_50._8_8_ + *(long *)(*(_func_int **)local_50._8_8_ + -0x10))
        ;
        return (bool)uVar2;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4e3,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                 (char (*) [33])"couldn\'t create parent directory");
    }
    bVar8 = false;
    kj::_::Debug::Fault::~Fault((Fault *)local_50);
  }
  return bVar8;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        entry->init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }